

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,type_info **key,TrackerItem **value)

{
  BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined8 *puVar2;
  long lVar3;
  code *pcVar4;
  char cVar5;
  bool bVar6;
  hash_t hVar7;
  int iVar8;
  undefined4 *puVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  lVar12 = *(long *)this;
  if (lVar12 == 0) {
    BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar12 = *(long *)this;
  }
  uVar14 = (uint)((ulong)*key >> 4) & 0x7fffffff;
  hVar7 = PrimePolicy::ModPrime(uVar14,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar12 + (ulong)hVar7 * 4);
  if ((int)uVar13 < 0) {
    cVar5 = (char)(uVar13 >> 0x18);
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      puVar2 = (undefined8 *)(*(long *)(this + 8) + (ulong)uVar13 * 0x18);
      if ((type_info *)puVar2[2] == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
        }
        *puVar2 = *value;
        return uVar13;
      }
      uVar11 = uVar11 + 1;
      uVar13 = *(uint *)(puVar2 + 1);
    } while (-1 < (int)uVar13);
    cVar5 = (char)(uVar13 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  if (cVar5 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      uVar13 = *(uint *)(this + 0x20);
      if (uVar13 == *(uint *)(this + 0x18)) {
        BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        hVar7 = PrimePolicy::ModPrime(uVar14,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
        uVar13 = *(uint *)(this + 0x20);
      }
      *(uint *)(this + 0x20) = uVar13 + 1;
      if (*(int *)(this + 0x18) < (int)(uVar13 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar6) goto LAB_007340e0;
        *puVar9 = 0;
      }
      if (*(int *)(this + 0x18) <= (int)uVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar6) goto LAB_007340e0;
        *puVar9 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar6) goto LAB_007340e0;
        *puVar9 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar6) goto LAB_007340e0;
        *puVar9 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar6) {
LAB_007340e0:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      uVar13 = *(uint *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar8 = BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex
                          ((EntryType *)((long)(int)uVar13 * 0x18 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar8;
      }
    }
    lVar12 = *(long *)(this + 8);
    lVar10 = (long)(int)uVar13;
    *(TrackerItem **)(lVar12 + lVar10 * 0x18) = *value;
    *(type_info **)(lVar12 + 0x10 + lVar10 * 0x18) = *key;
    lVar3 = *(long *)this;
    *(undefined4 *)(lVar12 + 8 + lVar10 * 0x18) = *(undefined4 *)(lVar3 + (ulong)hVar7 * 4);
    *(uint *)(lVar3 + (ulong)hVar7 * 4) = uVar13;
    uVar11 = 0;
    uVar14 = uVar13;
    do {
      uVar14 = *(uint *)(lVar12 + 8 + (long)(int)uVar14 * 0x18);
      uVar11 = uVar11 + 1;
    } while (uVar14 != 0xffffffff);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar11);
    }
  }
  return uVar13;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }